

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  byte *pbVar1;
  float fVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  char *format;
  long lVar6;
  char buf [128];
  undefined8 local_a8;
  undefined8 uStack_a0;
  
  switch((const_->type_).enum_) {
  case V128:
    Writef(this,"v128_const(0x%02x",(ulong)(const_->data_).v[0]);
    lVar6 = 1;
    do {
      local_a8 = *(undefined8 *)(const_->data_).v;
      uStack_a0 = *(undefined8 *)((const_->data_).v + 8);
      pbVar1 = (byte *)((long)&local_a8 + lVar6);
      lVar6 = lVar6 + 1;
      Writef(this,", 0x%02x",(ulong)*pbVar1);
    } while (lVar6 != 0x10);
    WriteData(this,")",1);
    return;
  case F64:
    uVar3 = *(ulong *)(const_->data_).v;
    if ((~uVar3 & 0x7ff0000000000000) != 0) {
      snprintf((char *)&local_a8,0x80,"%.17g",uVar3);
      pcVar5 = strchr((char *)&local_a8,0x2e);
      if ((pcVar5 == (char *)0x0) &&
         (pcVar5 = strchr((char *)&local_a8,0x65), pcVar5 == (char *)0x0)) {
        sVar4 = strlen((char *)&local_a8);
        *(undefined2 *)((long)&local_a8 + sVar4) = 0x302e;
        *(undefined1 *)((long)&local_a8 + sVar4 + 2) = 0;
      }
      Writef(this,"%s",&local_a8);
      return;
    }
    pcVar5 = "  -";
    if (-1 < (long)uVar3) {
      pcVar5 = "\n\n";
    }
    if ((uVar3 & 0xfffffffffffff) != 0) {
      Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */");
      return;
    }
    break;
  case F32:
    fVar2 = *(float *)(const_->data_).v;
    if ((~(uint)fVar2 & 0x7f800000) != 0) {
      Writef(this,"%.9g",(double)fVar2);
      return;
    }
    pcVar5 = "  -";
    if (-1 < (int)fVar2) {
      pcVar5 = "\n\n";
    }
    if (((uint)fVar2 & 0x7fffff) != 0) {
      Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */");
      return;
    }
    break;
  case I64:
    pcVar5 = *(char **)(const_->data_).v;
    format = "%luull";
    goto LAB_001a6b09;
  case I32:
    Writef(this,"%uu",(ulong)*(uint *)(const_->data_).v);
    return;
  default:
    abort();
  }
  pcVar5 = pcVar5 + 2;
  format = "%sINFINITY";
LAB_001a6b09:
  Writef(this,format,pcVar5);
  return;
}

Assistant:

explicit WrapperRef(const std::string& name)
      : GlobalName(ModuleFieldType::Func, name) {}